

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::post(upnp *this,rootdevice *d,char *soap,char *soap_action)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  element_type *peVar6;
  double __x;
  char local_838 [8];
  char header [2048];
  char *soap_action_local;
  char *soap_local;
  rootdevice *d_local;
  upnp *this_local;
  
  uVar2 = ::std::__cxx11::string::c_str();
  uVar3 = ::std::__cxx11::string::c_str();
  uVar1 = d->port;
  sVar4 = strlen(soap);
  uVar5 = ::std::__cxx11::string::c_str();
  snprintf(local_838,0x800,
           "POST %s HTTP/1.1\r\nHost: %s:%d\r\nContent-Type: text/xml; charset=\"utf-8\"\r\nContent-Length: %d\r\nSoapaction: \"%s#%s\"\r\n\r\n%s"
           ,uVar2,uVar3,(ulong)uVar1,(int)sVar4,uVar5,soap_action,soap);
  peVar6 = ::std::
           __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&d->upnp_connection);
  __x = (double)::std::__cxx11::string::operator=((string *)&peVar6->m_sendbuffer,local_838);
  log(this,__x);
  return;
}

Assistant:

void upnp::post(upnp::rootdevice const& d, char const* soap
	, char const* soap_action)
{
	TORRENT_ASSERT(is_single_thread());
	TORRENT_ASSERT(d.magic == 1337);
	TORRENT_ASSERT(d.upnp_connection);
	TORRENT_ASSERT(!d.disabled);

	char header[2048];
	std::snprintf(header, sizeof(header), "POST %s HTTP/1.1\r\n"
		"Host: %s:%d\r\n"
		"Content-Type: text/xml; charset=\"utf-8\"\r\n"
		"Content-Length: %d\r\n"
		"Soapaction: \"%s#%s\"\r\n\r\n"
		"%s"
		, d.path.c_str(), d.hostname.c_str(), d.port
		, int(strlen(soap)), d.service_namespace.c_str(), soap_action
		, soap);

	d.upnp_connection->m_sendbuffer = header;

#ifndef TORRENT_DISABLE_LOGGING
	log("sending: %s", header);
#endif
}